

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

int nettlp_pcie_cfg_init(nettlp_pcie_cfg *ntpc)

{
  int iVar1;
  long in_RDI;
  in_addr unaff_retaddr;
  int fd;
  uint16_t in_stack_fffffffffffffff8;
  uint16_t in_stack_fffffffffffffffa;
  in_addr in_stack_fffffffffffffffc;
  
  iVar1 = nettlp_create_udp_socket
                    (unaff_retaddr,in_stack_fffffffffffffffa,in_stack_fffffffffffffffc,
                     in_stack_fffffffffffffff8);
  if (-1 < iVar1) {
    *(int *)(in_RDI + 8) = iVar1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nettlp_pcie_cfg_init(struct nettlp_pcie_cfg *ntpc)
{
	int fd;

	fd = nettlp_create_udp_socket(ntpc->remote_addr, NETTLP_PCIE_CFG_PORT,
				      ntpc->local_addr, NETTLP_PCIE_CFG_PORT);
	if (fd < 0)
		return fd;

	ntpc->sockfd = fd;
	return 0;
}